

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_lambda.cpp
# Opt level: O2

void use_lambda_expressions(void)

{
  int iVar1;
  time_t tVar2;
  pointer piVar3;
  allocator_type local_39;
  vector<int,_std::allocator<int>_> numbers;
  
  std::vector<int,_std::allocator<int>_>::vector(&numbers,0x27,&local_39);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (piVar3 = numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar3 != numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    iVar1 = rand();
    *piVar3 = iVar1;
  }
  std::operator<<((ostream *)&std::cout,"Sample size = ");
}

Assistant:

void use_lambda_expressions() {
    using namespace std;

    vector<int> numbers(SIZE_1);
    //  init random seed
    srand(time(0));
    //  fill vector with randomized value
    generate(numbers.begin(), numbers.end(), rand);

//    cout << "numbers: " << numbers << endl;

    //  normal function
    cout << "Sample size = " << SIZE_1 << endl;
    int count_3 = count_if(numbers.begin(), numbers.end(), d3);
    cout << "count of numbers dividable by 3: " << count_3 << endl;

    int count_13 = count_if(numbers.begin(), numbers.end(), d13);
    cout << "count of numbers dividable by 13: " << count_13 << endl;

    numbers.resize(SIZE_2);
    generate(numbers.begin(), numbers.end(), rand);
    cout << "Sample size = " << SIZE_1 << endl;

    //  use class functor
    class divider {
    private:
        int _dv;
    public:
        divider(int v = 1): _dv(v) {};
        bool operator() (int x) {
            return x % _dv == 0;
        }
    };

    count_3 = count_if(numbers.begin(), numbers.end(), divider(3));
    cout << "count of numbers dividable by 3: " << count_3 << endl;

    count_13 = count_if(numbers.begin(), numbers.end(), divider(13));
    cout << "count of numbers dividable by 13: " << count_13 << endl;

    //  use lambda expression
    numbers.resize(SIZE_3);
    generate(numbers.begin(), numbers.end(), rand);
    cout << "Sample size = " << SIZE_1 << endl;

    count_3 = count_if(numbers.begin(), numbers.end(), [](int x){
        return x % 3 == 0;
    });
    cout << "count of numbers dividable by 3: " << count_3 << endl;

    count_13 = count_if(numbers.begin(), numbers.end(), [](int x){
        return x % 13 == 0;
    });
    cout << "count of numbers dividable by 13: " << count_13 << endl;
}